

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu2.c
# Opt level: O1

MPP_RET hal_vp8d_vdpu2_gen_regs(void *hal,HalTaskInfo *task)

{
  uint *puVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  int index;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  MppDev dev;
  long lVar20;
  uint uVar21;
  int iVar22;
  bool bVar23;
  MppBuffer framebuf;
  MppBuffer streambuf;
  MppBuffer local_50;
  uint *local_48;
  uint *local_40;
  MppBuffer local_38;
  
  local_50 = (MppBuffer)0x0;
  lVar2 = *(long *)((long)hal + 0x18);
  pvVar3 = (task->dec).syntax.data;
  if (((byte)hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x1c4,
               "hal_vp8d_vdpu2_gen_regs");
  }
  pvVar6 = *(void **)((long)hal + 0x18);
  if (((byte)hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0xa6,
               "hal_vp8_init_hwcfg");
  }
  memset(pvVar6,0,0x27c);
  *(uint *)((long)pvVar6 + 200) = *(uint *)((long)pvVar6 + 200) & 0xfffff380;
  *(undefined4 *)((long)pvVar6 + 0xd4) = 10;
  *(byte *)((long)pvVar6 + 0xd8) = *(byte *)((long)pvVar6 + 0xd8) | 0x3f;
  *(byte *)((long)pvVar6 + 0xdc) = *(byte *)((long)pvVar6 + 0xdc) & 0xfe;
  *(uint *)((long)pvVar6 + 0xe0) = *(uint *)((long)pvVar6 + 0xe0) & 0xffa00000 | 0x100000;
  *(uint *)((long)pvVar6 + 0xe4) = *(uint *)((long)pvVar6 + 0xe4) & 0xffffffcb | 0x30;
  iVar4 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)hal + 0x38),"hal_vp8_init_hwcfg");
  *(int *)((long)pvVar6 + 0x254) = iVar4;
  iVar4 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)hal + 0x30),"hal_vp8_init_hwcfg");
  *(int *)((long)pvVar6 + 0xf4) = iVar4;
  if (((byte)hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0xc4,
               "hal_vp8_init_hwcfg");
  }
  uVar5 = *(int *)((long)pvVar3 + 4) + 0xf;
  uVar21 = uVar5 >> 4;
  uVar14 = *(int *)((long)pvVar3 + 8) + 0xf;
  *(uint *)(lVar2 + 0x1e0) =
       uVar14 >> 0xc & 7 |
       uVar5 >> 10 & 0x38 |
       (uVar14 & 0xff0) << 7 | *(uint *)(lVar2 + 0x1e0) & 0x7807c0 | uVar21 << 0x17;
  if (((*(byte *)((long)pvVar3 + 0xd) & 1) == 0) &&
     (pvVar6 = mpp_buffer_get_ptr_with_caller
                         (*(MppBuffer *)((long)hal + 0x38),"hal_vp8d_vdpu2_gen_regs"),
     pvVar6 != (void *)0x0)) {
    memset(pvVar6,0,0xc00);
  }
  puVar7 = (undefined1 *)
           mpp_buffer_get_ptr_with_caller
                     (*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu2_gen_regs");
  if (puVar7 != (undefined1 *)0x0) {
    if (((byte)hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x15d,
                 "hal_vp8hw_asic_probe_update");
    }
    *puVar7 = *(undefined1 *)((long)pvVar3 + 0x455);
    puVar7[1] = *(undefined1 *)((long)pvVar3 + 0x457);
    puVar7[2] = *(undefined1 *)((long)pvVar3 + 0x458);
    puVar7[3] = *(undefined1 *)((long)pvVar3 + 0x459);
    puVar7[4] = *(undefined1 *)((long)pvVar3 + 0x17);
    puVar7[5] = *(undefined1 *)((long)pvVar3 + 0x18);
    puVar7[6] = *(undefined1 *)((long)pvVar3 + 0x19);
    puVar7[7] = 0;
    puVar7[8] = *(undefined1 *)((long)pvVar3 + 0x45a);
    puVar7[9] = *(undefined1 *)((long)pvVar3 + 0x45b);
    puVar7[10] = *(undefined1 *)((long)pvVar3 + 0x45c);
    puVar7[0xb] = *(undefined1 *)((long)pvVar3 + 0x45d);
    puVar7[0xc] = *(undefined1 *)((long)pvVar3 + 0x45e);
    puVar7[0xd] = *(undefined1 *)((long)pvVar3 + 0x45f);
    puVar7[0xe] = *(undefined1 *)((long)pvVar3 + 0x460);
    puVar7[0xf] = 0;
    puVar7[0x10] = *(undefined1 *)((long)pvVar3 + 0x461);
    puVar7[0x11] = *(undefined1 *)((long)pvVar3 + 0x474);
    puVar7[0x12] = *(undefined1 *)((long)pvVar3 + 0x462);
    puVar7[0x13] = *(undefined1 *)((long)pvVar3 + 0x475);
    puVar7[0x14] = *(undefined1 *)((long)pvVar3 + 0x472);
    puVar7[0x15] = *(undefined1 *)((long)pvVar3 + 0x473);
    puVar7[0x16] = *(undefined1 *)((long)pvVar3 + 0x485);
    puVar7[0x17] = *(undefined1 *)((long)pvVar3 + 0x486);
    puVar10 = puVar7 + 0x18;
    lVar11 = 0;
    do {
      lVar12 = lVar11 * 0x13 + 0x461;
      lVar16 = 0;
      do {
        puVar9 = puVar10;
        *puVar9 = *(undefined1 *)((long)pvVar3 + lVar16 + 9 + lVar12);
        puVar9[1] = *(undefined1 *)((long)pvVar3 + lVar16 + 10 + lVar12);
        puVar9[2] = *(undefined1 *)((long)pvVar3 + lVar16 + 0xb + lVar12);
        puVar9[3] = *(undefined1 *)((long)pvVar3 + lVar16 + 0xc + lVar12);
        puVar10 = puVar9 + 4;
        bVar23 = lVar16 == 0;
        lVar16 = lVar16 + 4;
      } while (bVar23);
      bVar23 = lVar11 == 0;
      lVar11 = lVar11 + 1;
    } while (bVar23);
    puVar8 = (undefined1 *)((long)pvVar3 + 0x469);
    lVar11 = 0;
    do {
      puVar10[lVar11 * 8] = puVar8[-6];
      puVar9[lVar11 * 8 + 5] = puVar8[-5];
      puVar9[lVar11 * 8 + 6] = puVar8[-4];
      puVar9[lVar11 * 8 + 7] = puVar8[-3];
      puVar9[lVar11 * 8 + 8] = puVar8[-2];
      puVar9[lVar11 * 8 + 9] = puVar8[-1];
      puVar9[lVar11 * 8 + 10] = *puVar8;
      puVar9[lVar11 * 8 + 0xb] = 0;
      lVar11 = lVar11 + 1;
      puVar8 = puVar8 + 0x13;
    } while (lVar11 == 1);
    puVar10 = puVar7 + 0x38;
    lVar11 = (long)pvVar3 + 0x38;
    lVar12 = 0;
    do {
      lVar19 = 0;
      lVar16 = lVar11;
      do {
        lVar20 = 0;
        do {
          *puVar10 = *(undefined1 *)(lVar16 + -3 + lVar20);
          puVar10[1] = *(undefined1 *)(lVar16 + -2 + lVar20);
          puVar10[2] = *(undefined1 *)(lVar16 + -1 + lVar20);
          puVar10[3] = *(undefined1 *)(lVar16 + lVar20);
          puVar10 = puVar10 + 4;
          lVar20 = lVar20 + 0xb;
        } while (lVar20 != 0x21);
        lVar19 = lVar19 + 1;
        lVar16 = lVar16 + 0x21;
      } while (lVar19 != 8);
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x108;
    } while (lVar12 != 4);
    puVar7 = puVar7 + 0x1b8;
    lVar11 = (long)pvVar3 + 0x3f;
    lVar12 = 0;
    do {
      lVar19 = 0;
      lVar16 = lVar11;
      do {
        lVar20 = 0;
        do {
          *puVar7 = *(undefined1 *)(lVar16 + -6 + lVar20);
          puVar7[1] = *(undefined1 *)(lVar16 + -5 + lVar20);
          puVar7[2] = *(undefined1 *)(lVar16 + -4 + lVar20);
          puVar7[3] = *(undefined1 *)(lVar16 + -3 + lVar20);
          puVar7[4] = *(undefined1 *)(lVar16 + -2 + lVar20);
          puVar7[5] = *(undefined1 *)(lVar16 + -1 + lVar20);
          puVar7[6] = *(undefined1 *)(lVar16 + lVar20);
          puVar7[7] = 0;
          puVar7 = puVar7 + 8;
          lVar20 = lVar20 + 0xb;
        } while (lVar20 != 0x21);
        lVar19 = lVar19 + 1;
        lVar16 = lVar16 + 0x21;
      } while (lVar19 != 8);
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x108;
    } while (lVar12 != 4);
    if (((byte)hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x1b5,
                 "hal_vp8hw_asic_probe_update");
    }
  }
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 8),*(byte *)((long)pvVar3 + 0xc) & 0x7f,SLOT_BUFFER,
             &local_50);
  iVar4 = mpp_buffer_get_fd_with_caller(local_50,"hal_vp8d_vdpu2_gen_regs");
  *(int *)(lVar2 + 0xfc) = iVar4;
  if ((*(byte *)((long)pvVar3 + 0xd) & 1) == 0) {
    *(int *)(lVar2 + 0x20c) = iVar4;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x83,(uVar14 >> 4) * uVar21);
  }
  else {
    uVar5 = *(byte *)((long)pvVar3 + 0x31) & 0x7f;
    if (uVar5 != 0x7f) {
      mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),uVar5,SLOT_BUFFER,&local_50);
      iVar4 = mpp_buffer_get_fd_with_caller(local_50,"hal_vp8d_vdpu2_gen_regs");
    }
    *(int *)(lVar2 + 0x20c) = iVar4;
  }
  uVar5 = *(byte *)((long)pvVar3 + 0x30) & 0x7f;
  if (uVar5 == 0x7f) {
    iVar4 = *(int *)(lVar2 + 0xfc);
  }
  else {
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),uVar5,SLOT_BUFFER,&local_50);
    iVar4 = mpp_buffer_get_fd_with_caller(local_50,"hal_vp8d_vdpu2_gen_regs");
  }
  *(int *)(lVar2 + 0x220) = iVar4;
  if (*(byte *)((long)pvVar3 + 0x32) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x88,(uint)*(byte *)((long)pvVar3 + 0x32));
  }
  uVar5 = *(byte *)((long)pvVar3 + 0x2f) & 0x7f;
  if (uVar5 == 0x7f) {
    iVar4 = *(int *)(lVar2 + 0xfc);
  }
  else {
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),uVar5,SLOT_BUFFER,&local_50);
    iVar4 = mpp_buffer_get_fd_with_caller(local_50,"hal_vp8d_vdpu2_gen_regs");
  }
  *(int *)(lVar2 + 0x224) = iVar4;
  if (*(byte *)((long)pvVar3 + 0x33) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x89,(uint)*(byte *)((long)pvVar3 + 0x33));
  }
  if ((*(byte *)((long)pvVar3 + 0xe) & 3) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x95,*(byte *)((long)pvVar3 + 0xe) & 3);
  }
  *(uint *)(lVar2 + 0xe4) =
       *(uint *)(lVar2 + 0xe4) & 0xffffbfff | (*(byte *)((long)pvVar3 + 0xd) & 1) << 0xe;
  *(uint *)(lVar2 + 200) =
       *(uint *)(lVar2 + 200) & 0xfffffdff | (uint)(*(char *)((long)pvVar3 + 0x456) == '\0') << 9;
  if ((*(byte *)((long)pvVar3 + 0xe) & 1) == 0) {
    *(uint *)(lVar2 + 0x204) =
         *(uint *)(lVar2 + 0x204) & 0xff03ffff | (*(byte *)((long)pvVar3 + 0x1b) & 0x3f) << 0x12;
  }
  else {
    if ((*(byte *)((long)pvVar3 + 0xe) & 4) == 0) {
      uVar21 = 0;
      uVar5 = (int)*(char *)((long)pvVar3 + 0x13) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar14 = 0;
      if ((-1 < (int)uVar5) && (uVar14 = 0xfc0000, (int)uVar5 < 0x40)) {
        uVar14 = (uVar5 & 0x3f) << 0x12;
      }
      uVar18 = *(uint *)(lVar2 + 0x204);
      *(uint *)(lVar2 + 0x204) = uVar18 & 0xff03ffff | uVar14;
      uVar5 = (int)*(char *)((long)pvVar3 + 0x14) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      if ((-1 < (int)uVar5) && (uVar21 = 0x3f000, (int)uVar5 < 0x40)) {
        uVar21 = (uVar5 & 0x3f) << 0xc;
      }
      *(uint *)(lVar2 + 0x204) = uVar18 & 0xff000fff | uVar14 | uVar21;
      uVar5 = (int)*(char *)((long)pvVar3 + 0x15) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar17 = 0;
      if ((-1 < (int)uVar5) && (uVar17 = 0xfc0, (int)uVar5 < 0x40)) {
        uVar17 = (uVar5 & 0x3f) << 6;
      }
      *(uint *)(lVar2 + 0x204) = uVar18 & 0xff00003f | uVar14 | uVar21 | uVar17;
      uVar15 = (int)*(char *)((long)pvVar3 + 0x16) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar5 = 0x3f;
      if ((int)uVar15 < 0x40) {
        uVar5 = uVar15 & 0x3f;
      }
      if ((int)uVar15 < 0) {
        uVar5 = 0;
      }
      uVar5 = uVar18 & 0xff000000 | uVar14 | uVar21 | uVar17 | uVar5;
    }
    else {
      uVar5 = *(uint *)(lVar2 + 0x204);
      uVar14 = (*(byte *)((long)pvVar3 + 0x13) & 0x3f) << 0x12;
      *(uint *)(lVar2 + 0x204) = uVar5 & 0xff03ffff | uVar14;
      uVar21 = (*(byte *)((long)pvVar3 + 0x14) & 0x3f) << 0xc;
      *(uint *)(lVar2 + 0x204) = uVar5 & 0xff000fff | uVar14 | uVar21;
      uVar18 = (*(byte *)((long)pvVar3 + 0x15) & 0x3f) << 6;
      *(uint *)(lVar2 + 0x204) = uVar5 & 0xff00003f | uVar14 | uVar21 | uVar18;
      uVar5 = uVar5 & 0xff000000 | uVar14 | uVar21 | uVar18 | *(byte *)((long)pvVar3 + 0x16) & 0x3f;
    }
    *(uint *)(lVar2 + 0x204) = uVar5;
  }
  uVar14 = (uint)*(byte *)((long)pvVar3 + 0x1a) << 0x1f;
  uVar5 = *(uint *)(lVar2 + 0x210);
  *(uint *)(lVar2 + 0x210) = uVar5 & 0x7fffffff | uVar14;
  *(uint *)(lVar2 + 0x210) =
       uVar5 & 0xfffffff | uVar14 | (*(byte *)((long)pvVar3 + 0x1c) & 7) << 0x1c;
  if (*(char *)((long)pvVar3 + 0x1b) == '\0') {
    *(byte *)(lVar2 + 0xc9) = *(byte *)(lVar2 + 0xc9) | 1;
  }
  if ((*(byte *)((long)pvVar3 + 0xd) & 0xe) != 6) {
    *(byte *)(lVar2 + 0x1e5) = *(byte *)(lVar2 + 0x1e5) | 0x20;
  }
  if ((*(int *)((long)pvVar3 + 0x488) == 2) && ((*(byte *)((long)pvVar3 + 0xd) & 6) != 0)) {
    *(byte *)(lVar2 + 0x1e5) = *(byte *)(lVar2 + 0x1e5) | 0x10;
  }
  uVar5 = *(uint *)(lVar2 + 0x1e8) & 0xffff00ff | (*(uint *)((long)pvVar3 + 0x48c) & 0xff) << 8;
  *(uint *)(lVar2 + 0x1e8) = uVar5;
  *(uint *)(lVar2 + 0x1e8) = CONCAT31((int3)(uVar5 >> 8),*(undefined1 *)((long)pvVar3 + 0x490));
  if ((*(byte *)((long)pvVar3 + 0xe) & 1) == 0) {
    *(uint *)(lVar2 + 0x208) =
         *(uint *)(lVar2 + 0x208) & 0xffc007ff |
         ((int)*(char *)((long)pvVar3 + 0x2a) & 0x7ffU) << 0xb;
  }
  else {
    if ((*(byte *)((long)pvVar3 + 0xe) & 4) == 0) {
      uVar21 = 0;
      uVar5 = (int)*(char *)((long)pvVar3 + 0xf) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar14 = 0;
      if ((-1 < (int)uVar5) && (uVar14 = 0x3f800, (int)uVar5 < 0x80)) {
        uVar14 = (uVar5 & 0x7ff) << 0xb;
      }
      uVar5 = *(uint *)(lVar2 + 0x208);
      *(uint *)(lVar2 + 0x208) = uVar5 & 0xffc007ff | uVar14;
      uVar17 = (int)*(char *)((long)pvVar3 + 0x10) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar18 = uVar17 & 0x7ff;
      if (0x7f < (int)uVar17) {
        uVar18 = 0x7f;
      }
      if ((int)uVar17 < 0) {
        uVar18 = 0;
      }
      *(uint *)(lVar2 + 0x208) = uVar5 & 0xffc00000 | uVar14 | uVar18;
      uVar5 = (int)*(char *)((long)pvVar3 + 0x11) + (int)*(char *)((long)pvVar3 + 0x2a);
      if ((-1 < (int)uVar5) && (uVar21 = 0x3f800, (int)uVar5 < 0x80)) {
        uVar21 = (uVar5 & 0x7ff) << 0xb;
      }
      uVar14 = *(uint *)(lVar2 + 0x25c);
      *(uint *)(lVar2 + 0x25c) = uVar14 & 0xffc007ff | uVar21;
      uVar17 = (int)*(char *)((long)pvVar3 + 0x12) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar18 = uVar17 & 0x7ff;
      if (0x7f < (int)uVar17) {
        uVar18 = 0x7f;
      }
      uVar5 = 0;
      if (-1 < (int)uVar17) {
        uVar5 = uVar18;
      }
      uVar5 = uVar14 & 0xffc00000 | uVar21 | uVar5;
    }
    else {
      uVar14 = ((int)*(char *)((long)pvVar3 + 0xf) & 0x7ffU) << 0xb;
      uVar5 = *(uint *)(lVar2 + 0x208);
      *(uint *)(lVar2 + 0x208) = uVar5 & 0xffc007ff | uVar14;
      *(uint *)(lVar2 + 0x208) =
           uVar5 & 0xffc00000 | uVar14 | (int)*(char *)((long)pvVar3 + 0x10) & 0x7ffU;
      uVar5 = *(uint *)(lVar2 + 0x25c);
      uVar14 = ((int)*(char *)((long)pvVar3 + 0x11) & 0x7ffU) << 0xb;
      *(uint *)(lVar2 + 0x25c) = uVar5 & 0xffc007ff | uVar14;
      uVar5 = uVar5 & 0xffc00000 | uVar14 | (int)*(char *)((long)pvVar3 + 0x12) & 0x7ffU;
    }
    *(uint *)(lVar2 + 0x25c) = uVar5;
  }
  uVar14 = (uint)*(byte *)((long)pvVar3 + 0x29) << 0x1b;
  uVar5 = *(uint *)(lVar2 + 0x208);
  *(uint *)(lVar2 + 0x208) = uVar5 & 0x7ffffff | uVar14;
  *(uint *)(lVar2 + 0x208) =
       uVar5 & 0x3fffff | uVar14 | (*(byte *)((long)pvVar3 + 0x2b) & 0x1f) << 0x16;
  uVar14 = *(int *)((long)pvVar3 + 0x2c) << 0x1b;
  uVar5 = *(uint *)(lVar2 + 0x25c);
  *(uint *)(lVar2 + 0x25c) = uVar5 & 0x7ffffff | uVar14;
  *(uint *)(lVar2 + 0x25c) =
       uVar5 & 0x3fffff | uVar14 | (*(byte *)((long)pvVar3 + 0x2d) & 0x1f) << 0x16;
  *(uint *)(lVar2 + 0x260) =
       *(uint *)(lVar2 + 0x260) & 0x7ffffff | (uint)*(byte *)((long)pvVar3 + 0x2e) << 0x1b;
  if (*(char *)((long)pvVar3 + 0x1d) != '\0') {
    uVar14 = (*(byte *)((long)pvVar3 + 0x1f) & 0x7f) << 0x15;
    uVar5 = *(uint *)(lVar2 + 0x214);
    *(uint *)(lVar2 + 0x214) = uVar5 & 0xf01fffff | uVar14;
    uVar21 = (*(byte *)((long)pvVar3 + 0x20) & 0x7f) << 0xe;
    *(uint *)(lVar2 + 0x214) = uVar5 & 0xf0003fff | uVar14 | uVar21;
    uVar18 = (*(byte *)((long)pvVar3 + 0x21) & 0x7f) << 7;
    *(uint *)(lVar2 + 0x214) = uVar5 & 0xf000007f | uVar14 | uVar21 | uVar18;
    *(uint *)(lVar2 + 0x214) =
         uVar5 & 0xf0000000 | uVar14 | uVar21 | uVar18 | *(byte *)((long)pvVar3 + 0x22) & 0x7f;
    uVar5 = *(uint *)(lVar2 + 0x210);
    uVar21 = (*(byte *)((long)pvVar3 + 0x23) & 0x7f) << 0x15;
    *(uint *)(lVar2 + 0x210) = uVar5 & 0xf01fffff | uVar21;
    uVar18 = (*(byte *)((long)pvVar3 + 0x24) & 0x7f) << 0xe;
    *(uint *)(lVar2 + 0x210) = uVar5 & 0xf0003fff | uVar21 | uVar18;
    uVar14 = (*(byte *)((long)pvVar3 + 0x25) & 0x7f) << 7;
    *(uint *)(lVar2 + 0x210) = uVar5 & 0xf000007f | uVar21 | uVar18 | uVar14;
    *(uint *)(lVar2 + 0x210) =
         uVar5 & 0xf0000000 | uVar21 | uVar18 | uVar14 | *(byte *)((long)pvVar3 + 0x26) & 0x7f;
  }
  if ((*(byte *)((long)pvVar3 + 0xd) & 6) == 0) {
    lVar11 = *(long *)((long)hal + 0x18);
    if (((byte)hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0xcc,
                 "hal_vp8d_pre_filter_tap_set");
    }
    *(uint *)(lVar11 + 0xec) = *(uint *)(lVar11 + 0xec) & 3 | 0x80000;
    *(uint *)(lVar11 + 0x264) = *(uint *)(lVar11 + 0x264) & 3 | 0x3fa1ec;
    *(uint *)(lVar11 + 0x268) = *(uint *)(lVar11 + 0x268) & 3 | 0x33fffd4;
    *(uint *)(lVar11 + 0x26c) = *(uint *)(lVar11 + 0x26c) & 3 | 0x1b024fe0;
    *(uint *)(lVar11 + 0x270) = *(uint *)(lVar11 + 0x270) & 3 | 0xfdc5d0c8;
    *(uint *)(lVar11 + 0x274) = *(uint *)(lVar11 + 0x274) & 3 | 0xfebf0134;
    *(uint *)(lVar11 + 0x278) = *(uint *)(lVar11 + 0x278) & 3 | 0x137f0fe8;
    *(uint *)(lVar11 + 500) = *(uint *)(lVar11 + 500) & 3 | 0xc85dfdc;
    *(uint *)(lVar11 + 0x1f8) = *(uint *)(lVar11 + 0x1f8) & 3 | 0xfe0241b0;
    *(uint *)(lVar11 + 0x1fc) = *(uint *)(lVar11 + 0x1fc) & 3 | 0xfd7ff030;
    *(undefined4 *)(lVar11 + 0x200) = 0x1effa9f6;
    if (((byte)hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0xf9,
                 "hal_vp8d_pre_filter_tap_set");
    }
  }
  local_38 = (MppBuffer)0x0;
  lVar11 = *(long *)((long)hal + 0x18);
  pvVar3 = (task->dec).syntax.data;
  if (((byte)hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x108,
               "hal_vp8d_dct_partition_cfg");
  }
  mpp_buf_slot_get_prop(*hal,(task->dec).input,SLOT_BUFFER,&local_38);
  iVar4 = mpp_buffer_get_fd_with_caller(local_38,"hal_vp8d_dct_partition_cfg");
  *(int *)(lVar11 + 0x244) = iVar4;
  if (*(RK_U32 *)((long)pvVar3 + 0x494) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x91,*(RK_U32 *)((long)pvVar3 + 0x494));
  }
  *(uint *)(lVar11 + 0x1e8) =
       *(uint *)(lVar11 + 0x1e8) & 0xff03ffff | (*(uint *)((long)pvVar3 + 0x4bc) & 0x3f) << 0x12;
  iVar22 = 0;
  if (*(int *)((long)pvVar3 + 0x488) == 2) {
    iVar22 = 7;
    if ((*(byte *)((long)pvVar3 + 0xd) & 1) != 0) {
      iVar22 = 0;
    }
  }
  *(uint *)(lVar11 + 0xcc) =
       ((*(int *)((long)pvVar3 + 0x4c4) + *(int *)((long)pvVar3 + 0x4c0)) -
       *(int *)((long)pvVar3 + 0x498)) + (*(int *)((long)pvVar3 + 0x498) + iVar22 & 7U) +
       (3 << (*(byte *)((long)pvVar3 + 0x27) & 0x1f)) + 0xfffffd & 0xffffff |
       (uint)*(byte *)(lVar11 + 0xcf) << 0x18;
  uVar14 = (uint)*(byte *)(lVar11 + 499) << 0x18;
  uVar5 = ((*(int *)((long)pvVar3 + 0x4c8) + iVar22 + *(int *)((long)pvVar3 + 0x4c0)) -
          *(int *)((long)pvVar3 + 0x494)) + 1U & 0xffffff;
  *(uint *)(lVar11 + 0x1f0) = uVar5 | uVar14;
  local_40 = (uint *)(lVar11 + 0x1e8);
  *(uint *)(lVar11 + 0x1f0) =
       (uVar5 | uVar14 & 0xf0ffffff |
       -0x1000000 << (*(byte *)((long)pvVar3 + 0x27) & 0x1f) & 0xf000000U) ^ 0xf000000;
  puVar1 = (uint *)(lVar11 + 600);
  local_48 = (uint *)(lVar11 + 0x1e4);
  uVar5 = 0xfffffffa;
  do {
    uVar18 = uVar5 + 6;
    uVar21 = *(int *)((long)pvVar3 + (ulong)uVar18 * 4 + 0x498) + iVar22;
    uVar14 = uVar21 & 0xfffffff8;
    if (uVar5 == 0xfffffffa) {
      *(int *)(lVar11 + 0x100) = iVar4;
      if (uVar14 != 0) {
        dev = *(MppDev *)((long)hal + 0x10);
        index = 0x40;
        goto LAB_00202cfd;
      }
    }
    else if (uVar18 < 6) {
      *(int *)(lVar11 + 0x230 + (ulong)(uVar5 + 5) * 4) = iVar4;
      if (uVar14 != 0) {
        dev = *(MppDev *)((long)hal + 0x10);
        index = uVar5 + 0x91;
LAB_00202cfd:
        mpp_dev_set_reg_offset(dev,index,uVar14);
      }
    }
    else {
      *(int *)(lVar11 + 0x248 + (ulong)uVar5 * 4) = iVar4;
      if (uVar14 != 0) {
        dev = *(MppDev *)((long)hal + 0x10);
        index = uVar5 + 0x92;
        goto LAB_00202cfd;
      }
    }
    if (uVar18 < 8) {
      uVar14 = uVar21 & 7;
      puVar13 = puVar1;
      switch((ulong)uVar18) {
      case 0:
        uVar14 = uVar21 * 0x20000000;
        uVar21 = 0x3ffffff;
        puVar13 = local_40;
        break;
      case 1:
        uVar14 = uVar21 * 0x20000000;
        uVar21 = 0x3ffffff;
        puVar13 = local_48;
        break;
      case 2:
        uVar14 = uVar14 << 0x17;
        uVar21 = 0xfc0fffff;
        puVar13 = local_48;
        break;
      case 3:
        uVar14 = uVar14 << 0x1b;
        uVar21 = 0xc0ffffff;
        break;
      case 4:
        uVar14 = uVar14 << 0x15;
        uVar21 = 0xff03ffff;
        break;
      case 5:
        uVar14 = uVar14 << 0xf;
        uVar21 = 0xfffc0fff;
        break;
      case 6:
        uVar14 = uVar14 << 9;
        uVar21 = 0xfffff03f;
        break;
      case 7:
        uVar14 = uVar14 << 3;
        uVar21 = 0xffffffc0;
      }
      *puVar13 = uVar21 & *puVar13 | uVar14;
    }
    uVar14 = uVar5 + 7;
    uVar5 = uVar5 + 1;
    if (uVar14 >> (*(byte *)((long)pvVar3 + 0x27) & 0x1f) != 0) {
      if (((byte)hal_vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x154,
                   "hal_vp8d_dct_partition_cfg");
      }
      *(byte *)(lVar2 + 0xe4) = *(byte *)(lVar2 + 0xe4) | 1;
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x30),0,"hal_vp8d_vdpu2_gen_regs");
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x38),0,"hal_vp8d_vdpu2_gen_regs");
      if (((byte)hal_vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x253,
                   "hal_vp8d_vdpu2_gen_regs");
      }
      return MPP_OK;
    }
  } while( true );
}

Assistant:

MPP_RET hal_vp8d_vdpu2_gen_regs(void* hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_U32 mb_width = 0, mb_height = 0;
    MppBuffer framebuf = NULL;
    RK_U8 *segmap_ptr = NULL;
    RK_U8 *probe_ptr = NULL;
    VP8DHalContext_t *ctx = (VP8DHalContext_t *)hal;
    VP8DRegSet_t *regs = (VP8DRegSet_t *)ctx->regs;
    DXVA_PicParams_VP8 *pic_param = (DXVA_PicParams_VP8 *)task->dec.syntax.data;

    FUN_T("FUN_IN");

    hal_vp8_init_hwcfg(ctx);
    mb_width = (pic_param->width + 15) >> 4;
    mb_height = (pic_param->height + 15) >> 4;
    // mpp_log("mb_width = %d mb_height = %d", mb_width, mb_height);
    regs->reg120.sw_pic_mb_width = mb_width & 0x1FF;
    regs->reg120.sw_pic_mb_hight_p =  mb_height & 0xFF;
    regs->reg120.sw_pic_mb_w_ext = mb_width >> 9;
    regs->reg120.sw_pic_mb_h_ext = mb_height >> 8;

    if (!pic_param->frame_type) {
        segmap_ptr = mpp_buffer_get_ptr(ctx->seg_map);
        if (NULL != segmap_ptr) {
            memset(segmap_ptr, 0, VP8D_MAX_SEGMAP_SIZE);
        }
    }

    probe_ptr = mpp_buffer_get_ptr(ctx->probe_table);
    if (NULL != probe_ptr) {
        hal_vp8hw_asic_probe_update(pic_param, probe_ptr);
    }
    mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->CurrPic.Index7Bits, SLOT_BUFFER, &framebuf);
    regs->reg63_cur_pic_base = mpp_buffer_get_fd(framebuf);
    if (!pic_param->frame_type) { //key frame

        regs->reg131_ref0_base = regs->reg63_cur_pic_base;

        mpp_dev_set_reg_offset(ctx->dev, 131, mb_width * mb_height);
    } else if (pic_param->lst_fb_idx.Index7Bits < 0x7f) { //config ref0 base
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->lst_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg131_ref0_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg131_ref0_base = regs->reg63_cur_pic_base;
    }

    /* golden reference */
    if (pic_param->gld_fb_idx.Index7Bits < 0x7f) {
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->gld_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg136_golden_ref_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg136_golden_ref_base = regs->reg63_cur_pic_base;
    }

    regs->reg136_golden_ref_base = regs->reg136_golden_ref_base;
    if (pic_param->ref_frame_sign_bias_golden) {
        mpp_dev_set_reg_offset(ctx->dev, 136, pic_param->ref_frame_sign_bias_golden);
    }

    /* alternate reference */
    if (pic_param->alt_fb_idx.Index7Bits < 0x7f) {
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->alt_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg137.alternate_ref_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg137.alternate_ref_base = regs->reg63_cur_pic_base;
    }

    regs->reg137.alternate_ref_base = regs->reg137.alternate_ref_base;
    if (pic_param->ref_frame_sign_bias_altref)
        mpp_dev_set_reg_offset(ctx->dev, 137, pic_param->ref_frame_sign_bias_altref);

    regs->reg149_segment_map_base = regs->reg149_segment_map_base;
    if (pic_param->stVP8Segments.segmentation_enabled + (pic_param->stVP8Segments.update_mb_segmentation_map << 1))
        mpp_dev_set_reg_offset(ctx->dev, 149, pic_param->stVP8Segments.segmentation_enabled
                               + (pic_param->stVP8Segments.update_mb_segmentation_map << 1));

    regs->reg57_enable_ctrl.sw_pic_inter_e = pic_param->frame_type;
    regs->reg50_dec_ctrl.sw_skip_mode = !pic_param->mb_no_coeff_skip;

    if (!pic_param->stVP8Segments.segmentation_enabled) {
        regs->reg129.sw_filt_level_0 = pic_param->filter_level;
    } else if (pic_param->stVP8Segments.update_mb_segmentation_data) {
        regs->reg129.sw_filt_level_0 = pic_param->stVP8Segments.segment_feature_data[1][0];
        regs->reg129.sw_filt_level_1 = pic_param->stVP8Segments.segment_feature_data[1][1];
        regs->reg129.sw_filt_level_2 = pic_param->stVP8Segments.segment_feature_data[1][2];
        regs->reg129.sw_filt_level_3 = pic_param->stVP8Segments.segment_feature_data[1][3];
    } else {
        regs->reg129.sw_filt_level_0 = CLIP3(0, 63, (RK_S32)pic_param->filter_level + pic_param->stVP8Segments.segment_feature_data[1][0]);
        regs->reg129.sw_filt_level_1 = CLIP3(0, 63, (RK_S32)pic_param->filter_level + pic_param->stVP8Segments.segment_feature_data[1][1]);
        regs->reg129.sw_filt_level_2 = CLIP3(0, 63, (RK_S32)pic_param->filter_level + pic_param->stVP8Segments.segment_feature_data[1][2]);
        regs->reg129.sw_filt_level_3 = CLIP3(0, 63, (RK_S32)pic_param->filter_level + pic_param->stVP8Segments.segment_feature_data[1][3]);
    }

    regs->reg132.sw_filt_type = pic_param->filter_type;
    regs->reg132.sw_filt_sharpness = pic_param->sharpness;

    if (pic_param->filter_level == 0) {
        regs->reg50_dec_ctrl.sw_filtering_dis = 1;
    }

    if (pic_param->version != 3) {
        regs->reg121.sw_romain_mv = 1;
    }

    if (pic_param->decMode == VP8HWD_VP8 && (pic_param->version & 0x3)) {
        regs->reg121.sw_eable_bilinear = 1;
    }
    regs->reg122.sw_boolean_value = pic_param->bool_value;
    regs->reg122.sw_boolean_range = pic_param->bool_range;

    {
        if (!pic_param->stVP8Segments.segmentation_enabled)
            regs->reg130.sw_quant_0 = pic_param->y1ac_delta_q;
        else if (pic_param->stVP8Segments.update_mb_segmentation_data) { /* absolute mode */
            regs->reg130.sw_quant_0 = pic_param->stVP8Segments.segment_feature_data[0][0];
            regs->reg130.sw_quant_1 = pic_param->stVP8Segments.segment_feature_data[0][1];
            regs->reg151.sw_quant_2 = pic_param->stVP8Segments.segment_feature_data[0][2];
            regs->reg151.sw_quant_3 = pic_param->stVP8Segments.segment_feature_data[0][3];
        } else { /* delta mode */
            regs->reg130.sw_quant_0 = CLIP3(0, 127, pic_param->y1ac_delta_q + pic_param->stVP8Segments.segment_feature_data[0][0]);
            regs->reg130.sw_quant_1 = CLIP3(0, 127, pic_param->y1ac_delta_q + pic_param->stVP8Segments.segment_feature_data[0][1]);
            regs->reg151.sw_quant_2 = CLIP3(0, 127, pic_param->y1ac_delta_q + pic_param->stVP8Segments.segment_feature_data[0][2]);
            regs->reg151.sw_quant_3 = CLIP3(0, 127, pic_param->y1ac_delta_q + pic_param->stVP8Segments.segment_feature_data[0][3]);
        }

        regs->reg130.sw_quant_delta_0 = pic_param->y1dc_delta_q;
        regs->reg130.sw_quant_delta_1 = pic_param->y2dc_delta_q;
        regs->reg151.sw_quant_delta_2 = pic_param->y2ac_delta_q;
        regs->reg151.sw_quant_delta_3 = pic_param->uvdc_delta_q;
        regs->reg152.sw_quant_delta_4 = pic_param->uvac_delta_q;

        if (pic_param->mode_ref_lf_delta_enabled) {
            regs->reg133.sw_filt_ref_adj_0 = pic_param->ref_lf_deltas[0];
            regs->reg133.sw_filt_ref_adj_1 = pic_param->ref_lf_deltas[1];
            regs->reg133.sw_filt_ref_adj_2 = pic_param->ref_lf_deltas[2];
            regs->reg133.sw_filt_ref_adj_3 = pic_param->ref_lf_deltas[3];
            regs->reg132.sw_filt_mb_adj_0  = pic_param->mode_lf_deltas[0];
            regs->reg132.sw_filt_mb_adj_1  = pic_param->mode_lf_deltas[1];
            regs->reg132.sw_filt_mb_adj_2  = pic_param->mode_lf_deltas[2];
            regs->reg132.sw_filt_mb_adj_3  = pic_param->mode_lf_deltas[3];
        }

    }

    if ((pic_param->version & 0x3) == 0)
        hal_vp8d_pre_filter_tap_set(ctx);

    hal_vp8d_dct_partition_cfg(ctx, task);
    regs->reg57_enable_ctrl.sw_dec_e = 1;

    mpp_buffer_sync_end(ctx->probe_table);
    mpp_buffer_sync_end(ctx->seg_map);

    FUN_T("FUN_OUT");
    return ret;
}